

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

void init_args_info(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->help_help = gengetopt_args_info_help[0];
  args_info->version_help = gengetopt_args_info_help[1];
  args_info->input_help = gengetopt_args_info_help[2];
  args_info->output_help = gengetopt_args_info_help[3];
  args_info->sele1_help = gengetopt_args_info_help[4];
  args_info->sele2_help = gengetopt_args_info_help[5];
  args_info->nbins_help = gengetopt_args_info_help[6];
  args_info->nbins_z_help = gengetopt_args_info_help[7];
  args_info->privilegedAxis_help = gengetopt_args_info_help[8];
  args_info->centroidX_help = gengetopt_args_info_help[9];
  args_info->centroidY_help = gengetopt_args_info_help[10];
  args_info->referenceZ_help = gengetopt_args_info_help[0xb];
  args_info->dropletR_help = gengetopt_args_info_help[0xc];
  args_info->threshDens_help = gengetopt_args_info_help[0xd];
  args_info->bufferLength_help = gengetopt_args_info_help[0xe];
  args_info->rcut_help = gengetopt_args_info_help[0xf];
  args_info->com_help = gengetopt_args_info_help[0x11];
  args_info->comvel_help = gengetopt_args_info_help[0x12];
  args_info->deltaCount_help = gengetopt_args_info_help[0x13];
  args_info->fluxOut_help = gengetopt_args_info_help[0x14];
  args_info->ca1_help = gengetopt_args_info_help[0x15];
  args_info->ca2_help = gengetopt_args_info_help[0x16];
  args_info->gcn_help = gengetopt_args_info_help[0x17];
  args_info->testequi_help = gengetopt_args_info_help[0x18];
  return;
}

Assistant:

static
void init_args_info(struct gengetopt_args_info *args_info)
{


  args_info->help_help = gengetopt_args_info_help[0] ;
  args_info->version_help = gengetopt_args_info_help[1] ;
  args_info->input_help = gengetopt_args_info_help[2] ;
  args_info->output_help = gengetopt_args_info_help[3] ;
  args_info->sele1_help = gengetopt_args_info_help[4] ;
  args_info->sele2_help = gengetopt_args_info_help[5] ;
  args_info->nbins_help = gengetopt_args_info_help[6] ;
  args_info->nbins_z_help = gengetopt_args_info_help[7] ;
  args_info->privilegedAxis_help = gengetopt_args_info_help[8] ;
  args_info->centroidX_help = gengetopt_args_info_help[9] ;
  args_info->centroidY_help = gengetopt_args_info_help[10] ;
  args_info->referenceZ_help = gengetopt_args_info_help[11] ;
  args_info->dropletR_help = gengetopt_args_info_help[12] ;
  args_info->threshDens_help = gengetopt_args_info_help[13] ;
  args_info->bufferLength_help = gengetopt_args_info_help[14] ;
  args_info->rcut_help = gengetopt_args_info_help[15] ;
  args_info->com_help = gengetopt_args_info_help[17] ;
  args_info->comvel_help = gengetopt_args_info_help[18] ;
  args_info->deltaCount_help = gengetopt_args_info_help[19] ;
  args_info->fluxOut_help = gengetopt_args_info_help[20] ;
  args_info->ca1_help = gengetopt_args_info_help[21] ;
  args_info->ca2_help = gengetopt_args_info_help[22] ;
  args_info->gcn_help = gengetopt_args_info_help[23] ;
  args_info->testequi_help = gengetopt_args_info_help[24] ;
  
}